

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O2

int stumpless_trace_message_str
              (stumpless_target *target,char *file,int line,char *func,char *message)

{
  int iVar1;
  
  if (target != (stumpless_target *)0x0) {
    iVar1 = stumpless_trace_log_str(target,target->default_prival,file,line,func,message);
    return iVar1;
  }
  raise_argument_empty("target was NULL");
  return -1;
}

Assistant:

int
stumpless_trace_message_str( struct stumpless_target *target,
                             const char *file,
                             int line,
                             const char *func,
                             const char *message ) {
  VALIDATE_ARG_NOT_NULL_INT_RETURN( target );

  return stumpless_trace_log_str( target,
                                  target->default_prival,
                                  file,
                                  line,
                                  func,
                                  message );
}